

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qform_.c
# Opt level: O3

void qform_(int *m,int *n,double *q,int *ldq,double *wa)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  size_t __n;
  ulong uVar18;
  double dVar19;
  double *local_38;
  
  iVar2 = *ldq;
  uVar11 = (ulong)iVar2;
  uVar6 = ~uVar11;
  uVar3 = *m;
  uVar4 = *n;
  uVar5 = uVar4;
  if ((int)uVar3 < (int)uVar4) {
    uVar5 = uVar3;
  }
  uVar13 = (ulong)uVar5;
  if (1 < (int)uVar5) {
    iVar15 = iVar2 * 2 + 1;
    __n = 0;
    do {
      __n = __n + 8;
      memset(q + uVar6 + (long)iVar15,0,__n);
      iVar15 = iVar15 + iVar2;
    } while ((ulong)(uVar5 - 1) << 3 != __n);
  }
  iVar15 = uVar3 - uVar4;
  if (iVar15 != 0 && (int)uVar4 <= (int)uVar3) {
    iVar16 = iVar2 * (uVar4 + 1) + 1;
    iVar7 = (uVar4 + 1) * (iVar2 + 1);
    do {
      if (0 < (int)uVar3) {
        memset(q + uVar6 + (long)iVar16,0,(ulong)uVar3 * 8);
      }
      q[uVar6 + (long)iVar7] = 1.0;
      iVar7 = iVar7 + iVar2 + 1;
      iVar16 = iVar16 + iVar2;
      iVar15 = iVar15 + -1;
    } while (iVar15 != 0);
  }
  if (0 < (int)uVar5) {
    local_38 = q + uVar11 * uVar13 + uVar6;
    iVar15 = uVar3 - uVar5;
    uVar18 = 1;
    uVar14 = uVar13;
    do {
      iVar15 = iVar15 + 1;
      lVar12 = (long)(int)uVar14;
      lVar10 = uVar13 - uVar18;
      if (lVar10 < (int)uVar3) {
        lVar8 = 0;
        do {
          wa[lVar12 + lVar8 + -1] = local_38[lVar12 + lVar8];
          local_38[lVar12 + lVar8] = 0.0;
          lVar8 = lVar8 + 1;
        } while (iVar15 != (int)lVar8);
      }
      q[uVar6 + (long)(((int)lVar10 + 1) * (iVar2 + 1))] = 1.0;
      if (lVar10 < (int)uVar3 && wa[lVar10] != 0.0) {
        lVar9 = (long)q + (uVar11 * 8 + 8) * lVar12 + uVar6 * 8;
        lVar8 = lVar12;
        do {
          dVar19 = 0.0;
          lVar17 = 0;
          do {
            dVar19 = dVar19 + *(double *)(lVar9 + lVar17 * 8) * wa[lVar12 + lVar17 + -1];
            lVar17 = lVar17 + 1;
          } while (iVar15 != (int)lVar17);
          dVar1 = wa[lVar10];
          lVar17 = 0;
          do {
            *(double *)(lVar9 + lVar17 * 8) =
                 wa[lVar12 + lVar17 + -1] * (-dVar19 / dVar1) + *(double *)(lVar9 + lVar17 * 8);
            lVar17 = lVar17 + 1;
          } while (iVar15 != (int)lVar17);
          lVar8 = lVar8 + 1;
          lVar9 = lVar9 + uVar11 * 8;
        } while (uVar3 + 1 != (int)lVar8);
      }
      uVar18 = uVar18 + 1;
      uVar14 = (ulong)((int)uVar14 - 1);
      local_38 = local_38 + -uVar11;
    } while (uVar18 != uVar5 + 1);
  }
  return;
}

Assistant:

__minpack_attr__
void __minpack_func__(qform)(const int *m, const int *n, real *q, const int *
	ldq, real *wa)
{
    /* System generated locals */
    int q_dim1, q_offset, i__1, i__2, i__3;

    /* Local variables */
    int i__, j, k, l, jm1, np1;
    real sum, temp;
    int minmn;

/*     ********** */

/*     subroutine qform */

/*     this subroutine proceeds from the computed qr factorization of */
/*     an m by n matrix a to accumulate the m by m orthogonal matrix */
/*     q from its factored form. */

/*     the subroutine statement is */

/*       subroutine qform(m,n,q,ldq,wa) */

/*     where */

/*       m is a positive integer input variable set to the number */
/*         of rows of a and the order of q. */

/*       n is a positive integer input variable set to the number */
/*         of columns of a. */

/*       q is an m by m array. on input the full lower trapezoid in */
/*         the first min(m,n) columns of q contains the factored form. */
/*         on output q has been accumulated into a square matrix. */

/*       ldq is a positive integer input variable not less than m */
/*         which specifies the leading dimension of the array q. */

/*       wa is a work array of length m. */

/*     subprograms called */

/*       fortran-supplied ... min0 */

/*     argonne national laboratory. minpack project. march 1980. */
/*     burton s. garbow, kenneth e. hillstrom, jorge j. more */

/*     ********** */
    /* Parameter adjustments */
    --wa;
    q_dim1 = *ldq;
    q_offset = 1 + q_dim1 * 1;
    q -= q_offset;

    /* Function Body */

/*     zero out upper triangle of q in the first min(m,n) columns. */

    minmn = min(*m,*n);
    if (minmn < 2) {
	goto L30;
    }
    i__1 = minmn;
    for (j = 2; j <= i__1; ++j) {
	jm1 = j - 1;
	i__2 = jm1;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    q[i__ + j * q_dim1] = 0.;
/* L10: */
	}
/* L20: */
    }
L30:

/*     initialize remaining columns to those of the identity matrix. */

    np1 = *n + 1;
    if (*m < np1) {
	goto L60;
    }
    i__1 = *m;
    for (j = np1; j <= i__1; ++j) {
	i__2 = *m;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    q[i__ + j * q_dim1] = 0.;
/* L40: */
	}
	q[j + j * q_dim1] = 1.;
/* L50: */
    }
L60:

/*     accumulate q from its factored form. */

    i__1 = minmn;
    for (l = 1; l <= i__1; ++l) {
	k = minmn - l + 1;
	i__2 = *m;
	for (i__ = k; i__ <= i__2; ++i__) {
	    wa[i__] = q[i__ + k * q_dim1];
	    q[i__ + k * q_dim1] = 0.;
/* L70: */
	}
	q[k + k * q_dim1] = 1.;
	if (wa[k] == 0.) {
	    goto L110;
	}
	i__2 = *m;
	for (j = k; j <= i__2; ++j) {
	    sum = 0.;
	    i__3 = *m;
	    for (i__ = k; i__ <= i__3; ++i__) {
		sum += q[i__ + j * q_dim1] * wa[i__];
/* L80: */
	    }
	    temp = sum / wa[k];
	    i__3 = *m;
	    for (i__ = k; i__ <= i__3; ++i__) {
		q[i__ + j * q_dim1] -= temp * wa[i__];
/* L90: */
	    }
/* L100: */
	}
L110:
/* L120: */
	;
    }
    return;

/*     last card of subroutine qform. */

}